

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

stumpless_target *
stumpless_set_target_filter(stumpless_target *target,stumpless_filter_func_t filter)

{
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
  }
  else {
    lock_target(target);
    target->filter = filter;
    unlock_target(target);
    clear_error();
  }
  return target;
}

Assistant:

struct stumpless_target *
stumpless_set_target_filter( struct stumpless_target *target,
                             stumpless_filter_func_t filter ) {
  VALIDATE_ARG_NOT_NULL( target );

  lock_target( target );
  target->filter = filter;
  unlock_target( target );

  clear_error(  );
  return target;
}